

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memwatch.c
# Opt level: O0

int mwFlushR(void)

{
  int local_c;
  
  if ((mwFlushing == mwFlushingB1) && (mwFlushing == mwFlushingB2)) {
    local_c = mwFlushing;
  }
  else {
    if (mwFlushing == mwFlushingB1) {
      mwFlushingB2 = mwFlushing;
    }
    if (mwFlushing == mwFlushingB2) {
      mwFlushingB1 = mwFlushing;
    }
    if (mwFlushingB1 == mwFlushingB2) {
      mwFlushing = mwFlushingB1;
    }
    if ((mwFlushing == mwFlushingB1) && (mwFlushing == mwFlushingB2)) {
      mwWrite("internal: flushing flag damaged and recovered\n");
      mwFlush();
      local_c = mwFlushing;
    }
    else {
      mwWrite("internal: flushing flag destroyed, so set to true\n");
      mwFlushingB2 = 1;
      mwFlushingB1 = 1;
      local_c = 1;
    }
  }
  mwFlushing = local_c;
  return local_c;
}

Assistant:

static int mwFlushR()
{
	if ((mwFlushing == mwFlushingB1) && (mwFlushing == mwFlushingB2)) {
		return mwFlushing;
	}
	if (mwFlushing == mwFlushingB1) {
		mwFlushingB2 = mwFlushing;
	}
	if (mwFlushing == mwFlushingB2) {
		mwFlushingB1 = mwFlushing;
	}
	if (mwFlushingB1 == mwFlushingB2) {
		mwFlushing = mwFlushingB1;
	}
	if ((mwFlushing == mwFlushingB1) && (mwFlushing == mwFlushingB2)) {
		mwWrite("internal: flushing flag damaged and recovered\n");
		FLUSH();
		return mwFlushing;
	}
	mwWrite("internal: flushing flag destroyed, so set to true\n");
	mwFlushing = mwFlushingB1 = mwFlushingB2 = 1;
	return 1;
}